

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  int iVar27;
  undefined4 uVar28;
  long lVar29;
  long lVar30;
  byte bVar31;
  uint uVar32;
  undefined4 uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong *puVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  bool bVar49;
  vint4 ai_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  vint4 ai;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar60;
  float fVar67;
  float fVar69;
  vint4 ai_3;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [32];
  vint4 ai_2;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_c30;
  undefined8 local_c00;
  uint uStack_bf8;
  uint uStack_bf4;
  uint uStack_bf0;
  uint uStack_bec;
  uint uStack_be8;
  uint uStack_be4;
  uint local_be0;
  uint uStack_bdc;
  uint uStack_bd8;
  uint uStack_bd4;
  uint uStack_bd0;
  uint uStack_bcc;
  uint uStack_bc8;
  uint uStack_bc4;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a00 [32];
  float local_9e0 [4];
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar36 = local_7f8;
  local_800 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar114 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_b30._4_4_ = fVar3;
  local_b30._0_4_ = fVar3;
  local_b30._8_4_ = fVar3;
  local_b30._12_4_ = fVar3;
  auVar93 = ZEXT1664(local_b30);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_b40._4_4_ = fVar4;
  local_b40._0_4_ = fVar4;
  local_b40._8_4_ = fVar4;
  local_b40._12_4_ = fVar4;
  auVar96 = ZEXT1664(local_b40);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_b50._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_b50._8_4_ = -fVar2;
  local_b50._12_4_ = -fVar2;
  auVar100 = ZEXT1664(local_b50);
  local_b60._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_b60._8_4_ = -fVar3;
  local_b60._12_4_ = -fVar3;
  auVar103 = ZEXT1664(local_b60);
  iVar27 = (tray->tnear).field_0.i[k];
  local_b70._4_4_ = iVar27;
  local_b70._0_4_ = iVar27;
  local_b70._8_4_ = iVar27;
  local_b70._12_4_ = iVar27;
  auVar106 = ZEXT1664(local_b70);
  local_b80._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  local_b80._8_4_ = -fVar4;
  local_b80._12_4_ = -fVar4;
  auVar109 = ZEXT1664(local_b80);
  iVar27 = (tray->tfar).field_0.i[k];
  local_b90._4_4_ = iVar27;
  local_b90._0_4_ = iVar27;
  local_b90._8_4_ = iVar27;
  local_b90._12_4_ = iVar27;
  auVar113 = ZEXT1664(local_b90);
  local_ac0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ac0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar27 = 1 << ((uint)k & 0x1f);
  auVar99._4_4_ = iVar27;
  auVar99._0_4_ = iVar27;
  auVar99._8_4_ = iVar27;
  auVar99._12_4_ = iVar27;
  auVar99._16_4_ = iVar27;
  auVar99._20_4_ = iVar27;
  auVar99._24_4_ = iVar27;
  auVar99._28_4_ = iVar27;
  auVar51 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar99 = vpand_avx2(auVar99,auVar51);
  local_b00 = vpcmpeqd_avx2(auVar99,auVar51);
  auVar51._8_4_ = 0xbf800000;
  auVar51._0_8_ = 0xbf800000bf800000;
  auVar51._12_4_ = 0xbf800000;
  auVar51._16_4_ = 0xbf800000;
  auVar51._20_4_ = 0xbf800000;
  auVar51._24_4_ = 0xbf800000;
  auVar51._28_4_ = 0xbf800000;
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = 0x3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar55._16_4_ = 0x3f800000;
  auVar55._20_4_ = 0x3f800000;
  auVar55._24_4_ = 0x3f800000;
  auVar55._28_4_ = 0x3f800000;
  _local_ae0 = vblendvps_avx(auVar55,auVar51,local_ac0);
  bVar26 = true;
  do {
    uVar44 = puVar36[-1];
    puVar36 = puVar36 + -1;
    while ((uVar44 & 8) == 0) {
      auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar38),auVar100._0_16_,
                                auVar114._0_16_);
      auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar41),auVar103._0_16_,
                                auVar93._0_16_);
      auVar80 = vpmaxsd_avx(auVar80,auVar50);
      auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar42),auVar109._0_16_,
                                auVar96._0_16_);
      auVar84 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar38 ^ 0x10)),
                                auVar100._0_16_,auVar114._0_16_);
      auVar61 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar41 ^ 0x10)),
                                auVar103._0_16_,auVar93._0_16_);
      auVar84 = vpminsd_avx(auVar84,auVar61);
      auVar61 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar44 + 0x20 + (uVar42 ^ 0x10)),
                                auVar109._0_16_,auVar96._0_16_);
      auVar50 = vpmaxsd_avx(auVar50,auVar106._0_16_);
      auVar80 = vpmaxsd_avx(auVar80,auVar50);
      auVar50 = vpminsd_avx(auVar61,auVar113._0_16_);
      auVar50 = vpminsd_avx(auVar84,auVar50);
      auVar80 = vpcmpgtd_avx(auVar80,auVar50);
      iVar27 = vmovmskps_avx(auVar80);
      if (iVar27 == 0xf) goto joined_r0x0059c74b;
      bVar31 = (byte)iVar27 ^ 0xf;
      uVar46 = uVar44 & 0xfffffffffffffff0;
      lVar30 = 0;
      for (uVar44 = (ulong)bVar31; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar44 = *(ulong *)(uVar46 + lVar30 * 8);
      uVar32 = bVar31 - 1 & (uint)bVar31;
      uVar35 = (ulong)uVar32;
      if (uVar32 != 0) {
        *puVar36 = uVar44;
        lVar30 = 0;
        for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar32 = uVar32 - 1 & uVar32;
        uVar35 = (ulong)uVar32;
        bVar49 = uVar32 == 0;
        while( true ) {
          puVar36 = puVar36 + 1;
          uVar44 = *(ulong *)(uVar46 + lVar30 * 8);
          if (bVar49) break;
          *puVar36 = uVar44;
          lVar30 = 0;
          for (uVar44 = uVar35; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
            lVar30 = lVar30 + 1;
          }
          uVar35 = uVar35 - 1 & uVar35;
          bVar49 = uVar35 == 0;
        }
      }
    }
    uVar46 = (ulong)((uint)uVar44 & 0xf);
    if (uVar46 != 8) {
      uVar44 = uVar44 & 0xfffffffffffffff0;
      lVar30 = 0;
      do {
        lVar29 = lVar30 * 0x58;
        lVar1 = uVar44 + lVar29;
        uVar28 = *(undefined4 *)(uVar44 + 0x38 + lVar29);
        auVar61._4_4_ = uVar28;
        auVar61._0_4_ = uVar28;
        auVar61._8_4_ = uVar28;
        auVar61._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(uVar44 + 0x44 + lVar29);
        auVar76._4_4_ = uVar28;
        auVar76._0_4_ = uVar28;
        auVar76._8_4_ = uVar28;
        auVar76._12_4_ = uVar28;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)((uVar38 >> 2) + 0x20 + lVar1);
        auVar80 = vpmovzxbd_avx(auVar80);
        auVar80 = vcvtdq2ps_avx(auVar80);
        auVar84 = vfmadd213ps_fma(auVar80,auVar76,auVar61);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(((uVar38 ^ 0x10) >> 2) + 0x20 + lVar1);
        auVar80 = vpmovzxbd_avx(auVar50);
        auVar80 = vcvtdq2ps_avx(auVar80);
        auVar61 = vfmadd213ps_fma(auVar80,auVar76,auVar61);
        uVar28 = *(undefined4 *)(uVar44 + 0x3c + lVar29);
        auVar77._4_4_ = uVar28;
        auVar77._0_4_ = uVar28;
        auVar77._8_4_ = uVar28;
        auVar77._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(uVar44 + 0x48 + lVar29);
        auVar81._4_4_ = uVar28;
        auVar81._0_4_ = uVar28;
        auVar81._8_4_ = uVar28;
        auVar81._12_4_ = uVar28;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)((uVar41 >> 2) + 0x20 + lVar1);
        auVar80 = vpmovzxbd_avx(auVar62);
        auVar80 = vcvtdq2ps_avx(auVar80);
        auVar62 = vfmadd213ps_fma(auVar80,auVar81,auVar77);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(((uVar41 ^ 0x10) >> 2) + 0x20 + lVar1);
        auVar80 = vpmovzxbd_avx(auVar63);
        auVar80 = vcvtdq2ps_avx(auVar80);
        auVar63 = vfmadd213ps_fma(auVar80,auVar81,auVar77);
        uVar28 = *(undefined4 *)(uVar44 + 0x40 + lVar29);
        auVar78._4_4_ = uVar28;
        auVar78._0_4_ = uVar28;
        auVar78._8_4_ = uVar28;
        auVar78._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(uVar44 + 0x4c + lVar29);
        auVar82._4_4_ = uVar28;
        auVar82._0_4_ = uVar28;
        auVar82._8_4_ = uVar28;
        auVar82._12_4_ = uVar28;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)((uVar42 >> 2) + 0x20 + lVar1);
        auVar80 = vpmovzxbd_avx(auVar87);
        auVar80 = vcvtdq2ps_avx(auVar80);
        auVar76 = vfmadd213ps_fma(auVar80,auVar82,auVar78);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = *(ulong *)(((uVar42 ^ 0x10) >> 2) + 0x20 + lVar1);
        auVar80 = vpmovzxbd_avx(auVar88);
        auVar80 = vcvtdq2ps_avx(auVar80);
        auVar77 = vfmadd213ps_fma(auVar80,auVar82,auVar78);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(uVar44 + 0x20 + lVar29);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)(uVar44 + 0x24 + lVar29);
        auVar50 = vpminub_avx(auVar79,auVar83);
        auVar80 = vpcmpeqb_avx(auVar79,auVar50);
        auVar50 = vpcmpeqd_avx(auVar50,auVar50);
        auVar80 = vpmovzxbd_avx(auVar80 ^ auVar50);
        auVar80 = vpslld_avx(auVar80 ^ auVar50,0x1f);
        uVar33 = vmovmskps_avx(auVar80);
        auVar80 = vfmadd213ps_fma(auVar84,auVar114._0_16_,auVar100._0_16_);
        auVar50 = vfmadd213ps_fma(auVar62,auVar93._0_16_,auVar103._0_16_);
        auVar80 = vpmaxsd_avx(auVar80,auVar50);
        auVar50 = vfmadd213ps_fma(auVar61,auVar114._0_16_,auVar100._0_16_);
        auVar84 = vfmadd213ps_fma(auVar63,auVar93._0_16_,auVar103._0_16_);
        auVar84 = vpminsd_avx(auVar50,auVar84);
        auVar50 = vfmadd213ps_fma(auVar76,auVar96._0_16_,auVar109._0_16_);
        auVar50 = vpmaxsd_avx(auVar50,auVar106._0_16_);
        auVar80 = vpmaxsd_avx(auVar80,auVar50);
        auVar50 = vfmadd213ps_fma(auVar77,auVar96._0_16_,auVar109._0_16_);
        auVar50 = vpminsd_avx(auVar50,auVar113._0_16_);
        auVar50 = vpminsd_avx(auVar84,auVar50);
        auVar80 = vpcmpgtd_avx(auVar80,auVar50);
        uVar28 = vmovmskps_avx(auVar80);
        bVar31 = ~(byte)uVar28 & (byte)uVar33;
        if (bVar31 != 0) {
          uVar35 = (ulong)bVar31;
          do {
            lVar29 = 0;
            for (uVar43 = uVar35; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar5 = *(ushort *)(lVar1 + lVar29 * 8);
            uVar6 = *(ushort *)(lVar1 + 2 + lVar29 * 8);
            local_be0 = *(uint *)(lVar1 + 0x50);
            uStack_bf8 = *(uint *)(lVar1 + 4 + lVar29 * 8);
            pGVar7 = (context->scene->geometries).items[local_be0].ptr;
            lVar29 = *(long *)&pGVar7->field_0x58;
            lVar39 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)uStack_bf8;
            uVar40 = uVar5 & 0x7fff;
            uVar45 = uVar6 & 0x7fff;
            uVar32 = *(uint *)(lVar29 + 4 + lVar39);
            uVar48 = (ulong)uVar32;
            uVar34 = (ulong)(uVar32 * uVar45 + *(int *)(lVar29 + lVar39) + uVar40);
            p_Var8 = pGVar7[1].intersectionFilterN;
            lVar9 = *(long *)&pGVar7[1].time_range.upper;
            auVar80 = *(undefined1 (*) [16])(lVar9 + (uVar34 + 1) * (long)p_Var8);
            auVar50 = *(undefined1 (*) [16])(lVar9 + (uVar34 + uVar48) * (long)p_Var8);
            lVar47 = uVar34 + uVar48 + 1;
            auVar84 = *(undefined1 (*) [16])(lVar9 + lVar47 * (long)p_Var8);
            auVar61 = *(undefined1 (*) [16])
                       (lVar9 + (uVar34 + (-1 < (short)uVar5) + 1) * (long)p_Var8);
            lVar37 = (ulong)(-1 < (short)uVar5) + lVar47;
            auVar62 = *(undefined1 (*) [16])(lVar9 + lVar37 * (long)p_Var8);
            uVar43 = 0;
            if (-1 < (short)uVar6) {
              uVar43 = uVar48;
            }
            auVar63 = *(undefined1 (*) [16])(lVar9 + (uVar34 + uVar48 + uVar43) * (long)p_Var8);
            auVar76 = *(undefined1 (*) [16])(lVar9 + (lVar47 + uVar43) * (long)p_Var8);
            auVar90._16_16_ = *(undefined1 (*) [16])(lVar9 + (uVar43 + lVar37) * (long)p_Var8);
            auVar90._0_16_ = auVar84;
            auVar78 = vunpcklps_avx(auVar80,auVar62);
            auVar77 = vunpckhps_avx(auVar80,auVar62);
            auVar79 = vunpcklps_avx(auVar61,auVar84);
            auVar61 = vunpckhps_avx(auVar61,auVar84);
            auVar81 = vunpcklps_avx(auVar77,auVar61);
            auVar82 = vunpcklps_avx(auVar78,auVar79);
            auVar61 = vunpckhps_avx(auVar78,auVar79);
            auVar78 = vunpcklps_avx(auVar50,auVar76);
            auVar77 = vunpckhps_avx(auVar50,auVar76);
            auVar79 = vunpcklps_avx(auVar84,auVar63);
            auVar63 = vunpckhps_avx(auVar84,auVar63);
            auVar77 = vunpcklps_avx(auVar77,auVar63);
            auVar83 = vunpcklps_avx(auVar78,auVar79);
            auVar63 = vunpckhps_avx(auVar78,auVar79);
            auVar64._16_16_ = auVar76;
            auVar64._0_16_ = auVar50;
            auVar56._16_16_ = auVar62;
            auVar56._0_16_ = auVar80;
            auVar99 = vunpcklps_avx(auVar56,auVar64);
            auVar52._16_16_ = auVar84;
            auVar52._0_16_ = *(undefined1 (*) [16])(lVar9 + (long)p_Var8 * uVar34);
            auVar51 = vunpcklps_avx(auVar52,auVar90);
            auVar13 = vunpcklps_avx(auVar51,auVar99);
            auVar12 = vunpckhps_avx(auVar51,auVar99);
            auVar99 = vunpckhps_avx(auVar56,auVar64);
            auVar51 = vunpckhps_avx(auVar52,auVar90);
            auVar56 = vunpcklps_avx(auVar51,auVar99);
            auVar53._16_16_ = auVar82;
            auVar53._0_16_ = auVar82;
            auVar57._16_16_ = auVar61;
            auVar57._0_16_ = auVar61;
            auVar85._16_16_ = auVar81;
            auVar85._0_16_ = auVar81;
            auVar89._16_16_ = auVar83;
            auVar89._0_16_ = auVar83;
            auVar97._16_16_ = auVar63;
            auVar97._0_16_ = auVar63;
            auVar101._16_16_ = auVar77;
            auVar101._0_16_ = auVar77;
            auVar51 = vsubps_avx(auVar13,auVar53);
            auVar99 = vsubps_avx(auVar12,auVar57);
            auVar55 = vsubps_avx(auVar56,auVar85);
            auVar52 = vsubps_avx(auVar89,auVar13);
            auVar10 = vsubps_avx(auVar97,auVar12);
            auVar11 = vsubps_avx(auVar101,auVar56);
            auVar20._4_4_ = auVar99._4_4_ * auVar11._4_4_;
            auVar20._0_4_ = auVar99._0_4_ * auVar11._0_4_;
            auVar20._8_4_ = auVar99._8_4_ * auVar11._8_4_;
            auVar20._12_4_ = auVar99._12_4_ * auVar11._12_4_;
            auVar20._16_4_ = auVar99._16_4_ * auVar11._16_4_;
            auVar20._20_4_ = auVar99._20_4_ * auVar11._20_4_;
            auVar20._24_4_ = auVar99._24_4_ * auVar11._24_4_;
            auVar20._28_4_ = auVar82._12_4_;
            auVar62 = vfmsub231ps_fma(auVar20,auVar10,auVar55);
            auVar21._4_4_ = auVar55._4_4_ * auVar52._4_4_;
            auVar21._0_4_ = auVar55._0_4_ * auVar52._0_4_;
            auVar21._8_4_ = auVar55._8_4_ * auVar52._8_4_;
            auVar21._12_4_ = auVar55._12_4_ * auVar52._12_4_;
            auVar21._16_4_ = auVar55._16_4_ * auVar52._16_4_;
            auVar21._20_4_ = auVar55._20_4_ * auVar52._20_4_;
            auVar21._24_4_ = auVar55._24_4_ * auVar52._24_4_;
            auVar21._28_4_ = auVar61._12_4_;
            auVar61 = vfmsub231ps_fma(auVar21,auVar11,auVar51);
            uVar28 = *(undefined4 *)(ray + k * 4);
            auVar104._4_4_ = uVar28;
            auVar104._0_4_ = uVar28;
            auVar104._8_4_ = uVar28;
            auVar104._12_4_ = uVar28;
            auVar104._16_4_ = uVar28;
            auVar104._20_4_ = uVar28;
            auVar104._24_4_ = uVar28;
            auVar104._28_4_ = uVar28;
            uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar107._4_4_ = uVar28;
            auVar107._0_4_ = uVar28;
            auVar107._8_4_ = uVar28;
            auVar107._12_4_ = uVar28;
            auVar107._16_4_ = uVar28;
            auVar107._20_4_ = uVar28;
            auVar107._24_4_ = uVar28;
            auVar107._28_4_ = uVar28;
            uVar28 = *(undefined4 *)(ray + k * 4 + 0x40);
            auVar110._4_4_ = uVar28;
            auVar110._0_4_ = uVar28;
            auVar110._8_4_ = uVar28;
            auVar110._12_4_ = uVar28;
            auVar110._16_4_ = uVar28;
            auVar110._20_4_ = uVar28;
            auVar110._24_4_ = uVar28;
            auVar110._28_4_ = uVar28;
            fVar2 = *(float *)(ray + k * 4 + 0x80);
            auVar98._4_4_ = fVar2;
            auVar98._0_4_ = fVar2;
            auVar98._8_4_ = fVar2;
            auVar98._12_4_ = fVar2;
            auVar98._16_4_ = fVar2;
            auVar98._20_4_ = fVar2;
            auVar98._24_4_ = fVar2;
            auVar98._28_4_ = fVar2;
            auVar13 = vsubps_avx(auVar13,auVar104);
            fVar3 = *(float *)(ray + k * 4 + 0xa0);
            auVar105._4_4_ = fVar3;
            auVar105._0_4_ = fVar3;
            auVar105._8_4_ = fVar3;
            auVar105._12_4_ = fVar3;
            auVar105._16_4_ = fVar3;
            auVar105._20_4_ = fVar3;
            auVar105._24_4_ = fVar3;
            auVar105._28_4_ = fVar3;
            auVar12 = vsubps_avx(auVar12,auVar107);
            fVar4 = *(float *)(ray + k * 4 + 0xc0);
            auVar108._4_4_ = fVar4;
            auVar108._0_4_ = fVar4;
            auVar108._8_4_ = fVar4;
            auVar108._12_4_ = fVar4;
            auVar108._16_4_ = fVar4;
            auVar108._20_4_ = fVar4;
            auVar108._24_4_ = fVar4;
            auVar108._28_4_ = fVar4;
            auVar56 = vsubps_avx(auVar56,auVar110);
            auVar22._4_4_ = fVar2 * auVar12._4_4_;
            auVar22._0_4_ = fVar2 * auVar12._0_4_;
            auVar22._8_4_ = fVar2 * auVar12._8_4_;
            auVar22._12_4_ = fVar2 * auVar12._12_4_;
            auVar22._16_4_ = fVar2 * auVar12._16_4_;
            auVar22._20_4_ = fVar2 * auVar12._20_4_;
            auVar22._24_4_ = fVar2 * auVar12._24_4_;
            auVar22._28_4_ = uVar28;
            auVar80 = vfmsub231ps_fma(auVar22,auVar13,auVar105);
            auVar23._4_4_ = auVar11._4_4_ * auVar80._4_4_;
            auVar23._0_4_ = auVar11._0_4_ * auVar80._0_4_;
            auVar23._8_4_ = auVar11._8_4_ * auVar80._8_4_;
            auVar23._12_4_ = auVar11._12_4_ * auVar80._12_4_;
            auVar23._16_4_ = auVar11._16_4_ * 0.0;
            auVar23._20_4_ = auVar11._20_4_ * 0.0;
            auVar23._24_4_ = auVar11._24_4_ * 0.0;
            auVar23._28_4_ = auVar11._28_4_;
            auVar11._4_4_ = auVar55._4_4_ * auVar80._4_4_;
            auVar11._0_4_ = auVar55._0_4_ * auVar80._0_4_;
            auVar11._8_4_ = auVar55._8_4_ * auVar80._8_4_;
            auVar11._12_4_ = auVar55._12_4_ * auVar80._12_4_;
            auVar11._16_4_ = auVar55._16_4_ * 0.0;
            auVar11._20_4_ = auVar55._20_4_ * 0.0;
            auVar11._24_4_ = auVar55._24_4_ * 0.0;
            auVar11._28_4_ = auVar55._28_4_;
            auVar111._0_4_ = fVar4 * auVar13._0_4_;
            auVar111._4_4_ = fVar4 * auVar13._4_4_;
            auVar111._8_4_ = fVar4 * auVar13._8_4_;
            auVar111._12_4_ = fVar4 * auVar13._12_4_;
            auVar111._16_4_ = fVar4 * auVar13._16_4_;
            auVar111._20_4_ = fVar4 * auVar13._20_4_;
            auVar111._24_4_ = fVar4 * auVar13._24_4_;
            auVar111._28_4_ = 0;
            auVar50 = vfmsub231ps_fma(auVar111,auVar56,auVar98);
            auVar80 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar50),auVar10);
            auVar50 = vfmadd231ps_fma(auVar11,auVar99,ZEXT1632(auVar50));
            auVar24._4_4_ = auVar51._4_4_ * auVar10._4_4_;
            auVar24._0_4_ = auVar51._0_4_ * auVar10._0_4_;
            auVar24._8_4_ = auVar51._8_4_ * auVar10._8_4_;
            auVar24._12_4_ = auVar51._12_4_ * auVar10._12_4_;
            auVar24._16_4_ = auVar51._16_4_ * auVar10._16_4_;
            auVar24._20_4_ = auVar51._20_4_ * auVar10._20_4_;
            auVar24._24_4_ = auVar51._24_4_ * auVar10._24_4_;
            auVar24._28_4_ = auVar10._28_4_;
            auVar84 = vfmsub231ps_fma(auVar24,auVar52,auVar99);
            auVar112._0_4_ = fVar3 * auVar56._0_4_;
            auVar112._4_4_ = fVar3 * auVar56._4_4_;
            auVar112._8_4_ = fVar3 * auVar56._8_4_;
            auVar112._12_4_ = fVar3 * auVar56._12_4_;
            auVar112._16_4_ = fVar3 * auVar56._16_4_;
            auVar112._20_4_ = fVar3 * auVar56._20_4_;
            auVar112._24_4_ = fVar3 * auVar56._24_4_;
            auVar112._28_4_ = 0;
            auVar63 = vfmsub231ps_fma(auVar112,auVar12,auVar108);
            fVar2 = auVar84._0_4_;
            fVar3 = auVar84._4_4_;
            auVar10._4_4_ = fVar4 * fVar3;
            auVar10._0_4_ = fVar4 * fVar2;
            fVar60 = auVar84._8_4_;
            auVar10._8_4_ = fVar4 * fVar60;
            fVar68 = auVar84._12_4_;
            auVar10._12_4_ = fVar4 * fVar68;
            auVar10._16_4_ = fVar4 * 0.0;
            auVar10._20_4_ = fVar4 * 0.0;
            auVar10._24_4_ = fVar4 * 0.0;
            auVar10._28_4_ = fVar4;
            auVar84 = vfmadd231ps_fma(auVar10,ZEXT1632(auVar61),auVar105);
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar62),auVar98);
            auVar91._8_4_ = 0x80000000;
            auVar91._0_8_ = 0x8000000080000000;
            auVar91._12_4_ = 0x80000000;
            auVar91._16_4_ = 0x80000000;
            auVar91._20_4_ = 0x80000000;
            auVar91._24_4_ = 0x80000000;
            auVar91._28_4_ = 0x80000000;
            auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar63),auVar52);
            auVar99 = vandps_avx(ZEXT1632(auVar84),auVar91);
            uVar32 = auVar99._0_4_;
            auVar92._0_4_ = (float)(auVar80._0_4_ ^ uVar32);
            uVar14 = auVar99._4_4_;
            auVar92._4_4_ = (float)(auVar80._4_4_ ^ uVar14);
            uVar15 = auVar99._8_4_;
            auVar92._8_4_ = (float)(auVar80._8_4_ ^ uVar15);
            uVar16 = auVar99._12_4_;
            auVar92._12_4_ = (float)(auVar80._12_4_ ^ uVar16);
            fVar4 = auVar99._16_4_;
            auVar92._16_4_ = fVar4;
            fVar17 = auVar99._20_4_;
            auVar92._20_4_ = fVar17;
            fVar18 = auVar99._24_4_;
            auVar92._24_4_ = fVar18;
            fVar19 = auVar99._28_4_;
            auVar92._28_4_ = fVar19;
            auVar80 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar51,ZEXT1632(auVar63));
            auVar95._0_4_ = (float)(auVar80._0_4_ ^ uVar32);
            auVar95._4_4_ = (float)(auVar80._4_4_ ^ uVar14);
            auVar95._8_4_ = (float)(auVar80._8_4_ ^ uVar15);
            auVar95._12_4_ = (float)(auVar80._12_4_ ^ uVar16);
            auVar95._16_4_ = fVar4;
            auVar95._20_4_ = fVar17;
            auVar95._24_4_ = fVar18;
            auVar95._28_4_ = fVar19;
            auVar99 = vcmpps_avx(auVar92,ZEXT832(0) << 0x20,5);
            auVar51 = vcmpps_avx(auVar95,ZEXT832(0) << 0x20,5);
            auVar99 = vandps_avx(auVar51,auVar99);
            auVar65._8_4_ = 0x7fffffff;
            auVar65._0_8_ = 0x7fffffff7fffffff;
            auVar65._12_4_ = 0x7fffffff;
            auVar65._16_4_ = 0x7fffffff;
            auVar65._20_4_ = 0x7fffffff;
            auVar65._24_4_ = 0x7fffffff;
            auVar65._28_4_ = 0x7fffffff;
            local_a40 = vandps_avx(ZEXT1632(auVar84),auVar65);
            auVar51 = vcmpps_avx(ZEXT1632(auVar84),ZEXT832(0) << 0x20,4);
            auVar99 = vandps_avx(auVar99,auVar51);
            auVar102._0_4_ = auVar92._0_4_ + auVar95._0_4_;
            auVar102._4_4_ = auVar92._4_4_ + auVar95._4_4_;
            auVar102._8_4_ = auVar92._8_4_ + auVar95._8_4_;
            auVar102._12_4_ = auVar92._12_4_ + auVar95._12_4_;
            auVar102._16_4_ = fVar4 + fVar4;
            auVar102._20_4_ = fVar17 + fVar17;
            auVar102._24_4_ = fVar18 + fVar18;
            auVar102._28_4_ = fVar19 + fVar19;
            auVar51 = vcmpps_avx(auVar102,local_a40,2);
            auVar55 = auVar51 & auVar99;
            if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0x7f,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0xbf,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar55[0x1f] < '\0') {
              auVar99 = vandps_avx(auVar99,auVar51);
              auVar80 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              auVar25._4_4_ = fVar3 * auVar56._4_4_;
              auVar25._0_4_ = fVar2 * auVar56._0_4_;
              auVar25._8_4_ = fVar60 * auVar56._8_4_;
              auVar25._12_4_ = fVar68 * auVar56._12_4_;
              auVar25._16_4_ = auVar56._16_4_ * 0.0;
              auVar25._20_4_ = auVar56._20_4_ * 0.0;
              auVar25._24_4_ = auVar56._24_4_ * 0.0;
              auVar25._28_4_ = auVar56._28_4_;
              auVar50 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar61),auVar25);
              auVar50 = vfmadd213ps_fma(auVar13,ZEXT1632(auVar62),ZEXT1632(auVar50));
              local_a60._0_4_ = (float)(uVar32 ^ auVar50._0_4_);
              local_a60._4_4_ = (float)(uVar14 ^ auVar50._4_4_);
              local_a60._8_4_ = (float)(uVar15 ^ auVar50._8_4_);
              local_a60._12_4_ = (float)(uVar16 ^ auVar50._12_4_);
              local_a60._16_4_ = fVar4;
              local_a60._20_4_ = fVar17;
              local_a60._24_4_ = fVar18;
              local_a60._28_4_ = fVar19;
              fVar70 = *(float *)(ray + k * 4 + 0x60);
              fVar59 = local_a40._0_4_;
              fVar67 = local_a40._4_4_;
              auVar13._4_4_ = fVar67 * fVar70;
              auVar13._0_4_ = fVar59 * fVar70;
              fVar69 = local_a40._8_4_;
              auVar13._8_4_ = fVar69 * fVar70;
              fVar71 = local_a40._12_4_;
              auVar13._12_4_ = fVar71 * fVar70;
              fVar73 = local_a40._16_4_;
              auVar13._16_4_ = fVar73 * fVar70;
              fVar74 = local_a40._20_4_;
              auVar13._20_4_ = fVar74 * fVar70;
              fVar75 = local_a40._24_4_;
              auVar13._24_4_ = fVar75 * fVar70;
              auVar13._28_4_ = fVar70;
              auVar99 = vcmpps_avx(auVar13,local_a60,1);
              local_b20 = *(float *)(ray + k * 4 + 0x100);
              auVar12._4_4_ = local_b20 * fVar67;
              auVar12._0_4_ = local_b20 * fVar59;
              auVar12._8_4_ = local_b20 * fVar69;
              auVar12._12_4_ = local_b20 * fVar71;
              auVar12._16_4_ = local_b20 * fVar73;
              auVar12._20_4_ = local_b20 * fVar74;
              auVar12._24_4_ = local_b20 * fVar75;
              auVar12._28_4_ = auVar56._28_4_;
              auVar51 = vcmpps_avx(local_a60,auVar12,2);
              auVar99 = vandps_avx(auVar99,auVar51);
              auVar50 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
              auVar80 = vpand_avx(auVar80,auVar50);
              auVar99 = vpmovzxwd_avx2(auVar80);
              auVar99 = vpslld_avx2(auVar99,0x1f);
              if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar99 >> 0x7f,0) != '\0') ||
                    (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar99 >> 0xbf,0) != '\0') ||
                  (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar99[0x1f] < '\0') {
                auVar51 = vsubps_avx(local_a40,auVar95);
                local_aa0 = vblendvps_avx(auVar92,auVar51,local_ac0);
                auVar51 = vsubps_avx(local_a40,auVar92);
                local_a80 = vblendvps_avx(auVar95,auVar51,local_ac0);
                local_a00 = vpsrad_avx2(auVar99,0x1f);
                local_980._0_4_ = (float)local_ae0._0_4_ * auVar62._0_4_;
                local_980._4_4_ = (float)local_ae0._4_4_ * auVar62._4_4_;
                local_980._8_4_ = fStack_ad8 * auVar62._8_4_;
                local_980._12_4_ = fStack_ad4 * auVar62._12_4_;
                local_980._16_4_ = fStack_ad0 * 0.0;
                local_980._20_4_ = fStack_acc * 0.0;
                local_980._24_4_ = fStack_ac8 * 0.0;
                local_980._28_4_ = 0;
                local_960._4_4_ = (float)local_ae0._4_4_ * auVar61._4_4_;
                local_960._0_4_ = (float)local_ae0._0_4_ * auVar61._0_4_;
                local_960._8_4_ = fStack_ad8 * auVar61._8_4_;
                local_960._12_4_ = fStack_ad4 * auVar61._12_4_;
                local_960._16_4_ = fStack_ad0 * 0.0;
                local_960._20_4_ = fStack_acc * 0.0;
                local_960._24_4_ = fStack_ac8 * 0.0;
                local_960._28_4_ = 0;
                local_940._4_4_ = (float)local_ae0._4_4_ * fVar3;
                local_940._0_4_ = (float)local_ae0._0_4_ * fVar2;
                local_940._8_4_ = fStack_ad8 * fVar60;
                local_940._12_4_ = fStack_ad4 * fVar68;
                local_940._16_4_ = fStack_ad0 * 0.0;
                local_940._20_4_ = fStack_acc * 0.0;
                local_940._24_4_ = fStack_ac8 * 0.0;
                local_940._28_4_ = 0;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0059d0fe:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar26;
                  }
                  auVar54._0_8_ = (ulong)CONCAT24(uVar5,(uint)uVar5) & 0x7fff00007fff;
                  auVar54._8_4_ = uVar40;
                  auVar54._12_4_ = uVar40;
                  auVar54._16_4_ = uVar40;
                  auVar54._20_4_ = uVar40;
                  auVar54._24_4_ = uVar40;
                  auVar54._28_4_ = uVar40;
                  auVar99 = vpaddd_avx2(auVar54,_DAT_01fec4a0);
                  auVar84._0_4_ = (float)(int)(*(ushort *)(lVar29 + 8 + lVar39) - 1);
                  auVar84._4_12_ = auVar114._4_12_;
                  auVar58._0_8_ = (ulong)CONCAT24(uVar6,(uint)uVar6) & 0x7fff00007fff;
                  auVar58._8_4_ = uVar45;
                  auVar58._12_4_ = uVar45;
                  auVar58._16_4_ = uVar45;
                  auVar58._20_4_ = uVar45;
                  auVar58._24_4_ = uVar45;
                  auVar58._28_4_ = uVar45;
                  auVar51 = vpaddd_avx2(auVar58,_DAT_01fec4c0);
                  auVar50 = vrcpss_avx(auVar84,auVar84);
                  auVar84 = vfnmadd213ss_fma(auVar84,auVar50,SUB6416(ZEXT464(0x40000000),0));
                  auVar94._0_4_ = (float)(int)(*(ushort *)(lVar29 + 10 + lVar39) - 1);
                  auVar94._4_12_ = auVar114._4_12_;
                  fVar2 = auVar50._0_4_ * auVar84._0_4_;
                  auVar50 = vrcpss_avx(auVar94,auVar94);
                  auVar84 = vfnmadd213ss_fma(auVar94,auVar50,SUB6416(ZEXT464(0x40000000),0));
                  fVar3 = auVar50._0_4_ * auVar84._0_4_;
                  auVar99 = vcvtdq2ps_avx(auVar99);
                  fStack_9c4 = auVar99._28_4_ + local_aa0._28_4_;
                  auVar51 = vcvtdq2ps_avx(auVar51);
                  auVar55 = vrcpps_avx(local_a40);
                  auVar86._8_4_ = 0x3f800000;
                  auVar86._0_8_ = 0x3f8000003f800000;
                  auVar86._12_4_ = 0x3f800000;
                  auVar86._16_4_ = 0x3f800000;
                  auVar86._20_4_ = 0x3f800000;
                  auVar86._24_4_ = 0x3f800000;
                  auVar86._28_4_ = 0x3f800000;
                  auVar50 = vfnmadd213ps_fma(local_a40,auVar55,auVar86);
                  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar55,auVar55);
                  fVar60 = auVar50._0_4_;
                  fVar68 = auVar50._4_4_;
                  local_9a0._4_4_ = fVar68 * local_a60._4_4_;
                  local_9a0._0_4_ = fVar60 * local_a60._0_4_;
                  fVar70 = auVar50._8_4_;
                  local_9a0._8_4_ = fVar70 * local_a60._8_4_;
                  fVar72 = auVar50._12_4_;
                  local_9a0._12_4_ = fVar72 * local_a60._12_4_;
                  local_9a0._16_4_ = fVar4 * 0.0;
                  local_9a0._20_4_ = fVar17 * 0.0;
                  local_9a0._24_4_ = fVar18 * 0.0;
                  local_9a0._28_4_ = fVar19;
                  local_9e0[0] = (fVar59 * auVar99._0_4_ + local_aa0._0_4_) * fVar2 * fVar60;
                  local_9e0[1] = (fVar67 * auVar99._4_4_ + local_aa0._4_4_) * fVar2 * fVar68;
                  local_9e0[2] = (fVar69 * auVar99._8_4_ + local_aa0._8_4_) * fVar2 * fVar70;
                  local_9e0[3] = (fVar71 * auVar99._12_4_ + local_aa0._12_4_) * fVar2 * fVar72;
                  fStack_9d0 = (fVar73 * auVar99._16_4_ + local_aa0._16_4_) * fVar2 * 0.0;
                  fStack_9cc = (fVar74 * auVar99._20_4_ + local_aa0._20_4_) * fVar2 * 0.0;
                  fStack_9c8 = (fVar75 * auVar99._24_4_ + local_aa0._24_4_) * fVar2 * 0.0;
                  local_9c0._4_4_ = (fVar67 * auVar51._4_4_ + local_a80._4_4_) * fVar3 * fVar68;
                  local_9c0._0_4_ = (fVar59 * auVar51._0_4_ + local_a80._0_4_) * fVar3 * fVar60;
                  local_9c0._8_4_ = (fVar69 * auVar51._8_4_ + local_a80._8_4_) * fVar3 * fVar70;
                  local_9c0._12_4_ = (fVar71 * auVar51._12_4_ + local_a80._12_4_) * fVar3 * fVar72;
                  local_9c0._16_4_ = (fVar73 * auVar51._16_4_ + local_a80._16_4_) * fVar3 * 0.0;
                  local_9c0._20_4_ = (fVar74 * auVar51._20_4_ + local_a80._20_4_) * fVar3 * 0.0;
                  local_9c0._24_4_ = (fVar75 * auVar51._24_4_ + local_a80._24_4_) * fVar3 * 0.0;
                  local_9c0._28_4_ = fStack_9c4;
                  auVar80 = vpsllw_avx(auVar80,0xf);
                  if ((((((((auVar80 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar80 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar80 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar80 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar80[0xf] < '\0') {
                    auVar80 = vpacksswb_avx(auVar80,auVar80);
                    uVar43 = 0;
                    uVar48 = (ulong)(byte)(SUB161(auVar80 >> 7,0) & 1 |
                                           (SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                                           (SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                                           (SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                                           (SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                                           (SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                                           (SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                                          SUB161(auVar80 >> 0x3f,0) << 7);
                    for (uVar34 = uVar48; (uVar34 & 1) == 0;
                        uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                      uVar43 = uVar43 + 1;
                    }
                    local_c00 = CONCAT44(uStack_bf8,uStack_bf8);
                    local_ba0 = auVar114._0_16_;
                    uStack_bf4 = uStack_bf8;
                    uStack_bf0 = uStack_bf8;
                    uStack_bec = uStack_bf8;
                    uStack_be8 = uStack_bf8;
                    uStack_be4 = uStack_bf8;
                    uStack_bdc = local_be0;
                    uStack_bd8 = local_be0;
                    uStack_bd4 = local_be0;
                    uStack_bd0 = local_be0;
                    uStack_bcc = local_be0;
                    uStack_bc8 = local_be0;
                    uStack_bc4 = local_be0;
                    fStack_b1c = local_b20;
                    fStack_b18 = local_b20;
                    fStack_b14 = local_b20;
                    fStack_b10 = local_b20;
                    fStack_b0c = local_b20;
                    fStack_b08 = local_b20;
                    fStack_b04 = local_b20;
                    do {
                      local_8c0 = local_9e0[uVar43];
                      local_8a0 = *(undefined4 *)(local_9c0 + uVar43 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9a0 + uVar43 * 4)
                      ;
                      uVar28 = *(undefined4 *)(local_980 + uVar43 * 4);
                      uVar33 = *(undefined4 *)(local_960 + uVar43 * 4);
                      local_900._4_4_ = uVar33;
                      local_900._0_4_ = uVar33;
                      local_900._8_4_ = uVar33;
                      local_900._12_4_ = uVar33;
                      local_900._16_4_ = uVar33;
                      local_900._20_4_ = uVar33;
                      local_900._24_4_ = uVar33;
                      local_900._28_4_ = uVar33;
                      uVar33 = *(undefined4 *)(local_940 + uVar43 * 4);
                      local_8e0._4_4_ = uVar33;
                      local_8e0._0_4_ = uVar33;
                      local_8e0._8_4_ = uVar33;
                      local_8e0._12_4_ = uVar33;
                      local_8e0._16_4_ = uVar33;
                      local_8e0._20_4_ = uVar33;
                      local_8e0._24_4_ = uVar33;
                      local_8e0._28_4_ = uVar33;
                      local_c30.context = context->user;
                      local_920[0] = (RTCHitN)(char)uVar28;
                      local_920[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[4] = (RTCHitN)(char)uVar28;
                      local_920[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[8] = (RTCHitN)(char)uVar28;
                      local_920[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[0xc] = (RTCHitN)(char)uVar28;
                      local_920[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[0x10] = (RTCHitN)(char)uVar28;
                      local_920[0x11] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[0x12] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[0x13] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[0x14] = (RTCHitN)(char)uVar28;
                      local_920[0x15] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[0x16] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[0x17] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[0x18] = (RTCHitN)(char)uVar28;
                      local_920[0x19] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[0x1a] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[0x1b] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      local_920[0x1c] = (RTCHitN)(char)uVar28;
                      local_920[0x1d] = (RTCHitN)(char)((uint)uVar28 >> 8);
                      local_920[0x1e] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                      local_920[0x1f] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                      fStack_8bc = local_8c0;
                      fStack_8b8 = local_8c0;
                      fStack_8b4 = local_8c0;
                      fStack_8b0 = local_8c0;
                      fStack_8ac = local_8c0;
                      fStack_8a8 = local_8c0;
                      fStack_8a4 = local_8c0;
                      uStack_89c = local_8a0;
                      uStack_898 = local_8a0;
                      uStack_894 = local_8a0;
                      uStack_890 = local_8a0;
                      uStack_88c = local_8a0;
                      uStack_888 = local_8a0;
                      uStack_884 = local_8a0;
                      local_880 = local_c00;
                      uStack_878 = CONCAT44(uStack_bf4,uStack_bf8);
                      uStack_870 = CONCAT44(uStack_bec,uStack_bf0);
                      uStack_868 = CONCAT44(uStack_be4,uStack_be8);
                      local_860._4_4_ = uStack_bdc;
                      local_860._0_4_ = local_be0;
                      local_860._8_4_ = uStack_bd8;
                      local_860._12_4_ = uStack_bd4;
                      local_860._16_4_ = uStack_bd0;
                      local_860._20_4_ = uStack_bcc;
                      local_860._24_4_ = uStack_bc8;
                      local_860._28_4_ = uStack_bc4;
                      vpcmpeqd_avx2(local_860,local_860);
                      uStack_83c = (local_c30.context)->instID[0];
                      local_840 = uStack_83c;
                      uStack_838 = uStack_83c;
                      uStack_834 = uStack_83c;
                      uStack_830 = uStack_83c;
                      uStack_82c = uStack_83c;
                      uStack_828 = uStack_83c;
                      uStack_824 = uStack_83c;
                      uStack_81c = (local_c30.context)->instPrimID[0];
                      local_820 = uStack_81c;
                      uStack_818 = uStack_81c;
                      uStack_814 = uStack_81c;
                      uStack_810 = uStack_81c;
                      uStack_80c = uStack_81c;
                      uStack_808 = uStack_81c;
                      uStack_804 = uStack_81c;
                      local_bc0 = local_b00;
                      local_c30.valid = (int *)local_bc0;
                      local_c30.geometryUserPtr = pGVar7->userPtr;
                      local_c30.hit = local_920;
                      local_c30.N = 8;
                      local_c30.ray = (RTCRayN *)ray;
                      if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar7->occlusionFilterN)(&local_c30);
                      }
                      auVar51 = vpcmpeqd_avx2(local_bc0,_DAT_01faff00);
                      auVar99 = _DAT_01fe9960 & ~auVar51;
                      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar99 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar99 >> 0x7f,0) == '\0') &&
                            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar99 >> 0xbf,0) == '\0') &&
                          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar99[0x1f]) {
                        auVar51 = auVar51 ^ _DAT_01fe9960;
                      }
                      else {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var8)(&local_c30);
                        }
                        auVar99 = vpcmpeqd_avx2(local_bc0,_DAT_01faff00);
                        auVar51 = auVar99 ^ _DAT_01fe9960;
                        auVar66._8_4_ = 0xff800000;
                        auVar66._0_8_ = 0xff800000ff800000;
                        auVar66._12_4_ = 0xff800000;
                        auVar66._16_4_ = 0xff800000;
                        auVar66._20_4_ = 0xff800000;
                        auVar66._24_4_ = 0xff800000;
                        auVar66._28_4_ = 0xff800000;
                        auVar99 = vblendvps_avx(auVar66,*(undefined1 (*) [32])
                                                         (local_c30.ray + 0x100),auVar99);
                        *(undefined1 (*) [32])(local_c30.ray + 0x100) = auVar99;
                      }
                      if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar51 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar51 >> 0x7f,0) != '\0') ||
                            (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar51 >> 0xbf,0) != '\0') ||
                          (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar51[0x1f] < '\0') goto LAB_0059d0fe;
                      *(float *)(ray + k * 4 + 0x100) = local_b20;
                      uVar34 = uVar43 & 0x3f;
                      uVar43 = 0;
                      uVar48 = uVar48 ^ 1L << uVar34;
                      for (uVar34 = uVar48; (uVar34 & 1) == 0;
                          uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                        uVar43 = uVar43 + 1;
                      }
                      auVar114 = ZEXT1664(local_ba0);
                    } while (uVar48 != 0);
                  }
                }
              }
            }
            uVar35 = uVar35 - 1 & uVar35;
          } while (uVar35 != 0);
        }
        lVar30 = lVar30 + 1;
        auVar93 = ZEXT1664(local_b30);
        auVar96 = ZEXT1664(local_b40);
        auVar100 = ZEXT1664(local_b50);
        auVar103 = ZEXT1664(local_b60);
        auVar106 = ZEXT1664(local_b70);
        auVar109 = ZEXT1664(local_b80);
        auVar113 = ZEXT1664(local_b90);
      } while (lVar30 != uVar46 - 8);
    }
joined_r0x0059c74b:
    bVar26 = puVar36 != &local_800;
    if (!bVar26) {
      return bVar26;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }